

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

GlobalStateInfo
Fossilize::Hashing::parse_global_state_info
          (VkGraphicsPipelineCreateInfo *create_info,DynamicStateInfo *dynamic_info,
          SubpassMeta *meta)

{
  int iVar1;
  uint3 uVar2;
  uint uVar3;
  int *piVar4;
  ulong uVar5;
  ulong uVar6;
  uint3 uVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  byte bVar14;
  ulong uVar15;
  uint uVar16;
  long lVar17;
  bool bVar18;
  bool bVar19;
  GlobalStateInfo GVar20;
  
  for (piVar4 = (int *)create_info->pNext; piVar4 != (int *)0x0; piVar4 = *(int **)(piVar4 + 2)) {
    if (*piVar4 == 0x3b9fac02) goto LAB_0014cc9e;
  }
  piVar4 = (int *)0x0;
LAB_0014cc9e:
  uVar3 = 0xf;
  if ((piVar4 != (int *)0x0) && ((create_info->flags & 0x800) != 0)) {
    uVar3 = piVar4[4];
  }
  bVar14 = (byte)((uVar3 & 2) >> 1) &
           create_info->pRasterizationState != (VkPipelineRasterizationStateCreateInfo *)0x0;
  if (((dynamic_info->rasterizer_discard_enable == false) && (bVar14 != 0)) &&
     (create_info->pRasterizationState->rasterizerDiscardEnable == 1)) {
    uVar12 = 0;
    uVar13 = 0;
    uVar11 = 0;
    uVar6 = 0;
  }
  else {
    uVar12 = (ulong)meta->uses_color << 0x28;
    if (create_info->pColorBlendState == (VkPipelineColorBlendStateCreateInfo *)0x0) {
      uVar12 = 0;
    }
    uVar13 = (ulong)meta->uses_depth_stencil << 0x20;
    if (create_info->pDepthStencilState == (VkPipelineDepthStencilStateCreateInfo *)0x0) {
      uVar13 = 0;
    }
    uVar11 = (ulong)(create_info->pMultisampleState != (VkPipelineMultisampleStateCreateInfo *)0x0)
             << 0x18;
    uVar6 = (ulong)(create_info->pViewportState != (VkPipelineViewportStateCreateInfo *)0x0) << 0x10
    ;
  }
  bVar18 = create_info->pInputAssemblyState != (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  uVar15 = 0;
  uVar9 = (ulong)(dynamic_info->vertex_input ^ 1);
  if (create_info->pVertexInputState == (VkPipelineVertexInputStateCreateInfo *)0x0) {
    uVar9 = uVar15;
  }
  bVar8 = (byte)uVar9;
  if ((uVar3 & 6) == 0) {
    uVar7 = 1;
  }
  else {
    uVar7 = 0x10101;
    if ((ulong)create_info->stageCount == 0) {
      uVar15 = 0;
    }
    else {
      lVar17 = 0;
      bVar19 = false;
      do {
        iVar1 = *(int *)((long)&create_info->pStages->stage + lVar17);
        if (iVar1 < 0x40) {
          if ((iVar1 == 2) || (iVar1 == 4)) {
            bVar19 = create_info->pTessellationState != (VkPipelineTessellationStateCreateInfo *)0x0
            ;
          }
        }
        else if ((iVar1 == 0x40) || (iVar1 == 0x80)) {
          uVar9 = 0;
          bVar18 = false;
        }
        bVar8 = (byte)uVar9;
        lVar17 = lVar17 + 0x30;
      } while ((ulong)create_info->stageCount * 0x30 != lVar17);
      uVar15 = (ulong)bVar19 << 8;
    }
  }
  uVar16 = uVar3 >> 1 & 1;
  uVar2 = uVar7 & 0x10100;
  if ((uVar3 & 0xe) != 0) {
    uVar2 = uVar7;
  }
  uVar9 = 0;
  if ((uVar3 & 8) == 0) {
    uVar12 = uVar9;
  }
  if ((uVar3 & 4) == 0) {
    uVar13 = uVar9;
  }
  if ((uVar3 & 0xc) == 0) {
    uVar11 = uVar9;
  }
  if (uVar16 == 0) {
    uVar15 = uVar9;
    uVar6 = uVar9;
  }
  bVar19 = (uVar3 & 1) == 0;
  uVar10 = (ulong)bVar8 << 0x30;
  if (bVar19) {
    uVar10 = uVar9;
  }
  uVar5 = (ulong)bVar18;
  if (bVar19) {
    uVar5 = uVar9;
  }
  GVar20._0_8_ = uVar5 | uVar15 |
                 uVar10 | uVar6 | uVar13 | uVar12 | uVar11 | (ulong)(bVar14 & (byte)uVar16) << 0x38;
  GVar20.render_pass_state = (bool)(char)uVar2;
  GVar20.layout_state = (bool)(char)(uVar2 >> 8);
  GVar20.module_state = (bool)(char)(uVar2 >> 0x10);
  return GVar20;
}

Assistant:

static VkGraphicsPipelineLibraryFlagsEXT graphics_pipeline_get_effective_state_flags(
		const VkGraphicsPipelineCreateInfo &create_info)
{
	VkGraphicsPipelineLibraryFlagsEXT state_flags =
			VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_OUTPUT_INTERFACE_BIT_EXT |
			VK_GRAPHICS_PIPELINE_LIBRARY_PRE_RASTERIZATION_SHADERS_BIT_EXT |
			VK_GRAPHICS_PIPELINE_LIBRARY_VERTEX_INPUT_INTERFACE_BIT_EXT |
			VK_GRAPHICS_PIPELINE_LIBRARY_FRAGMENT_SHADER_BIT_EXT;

	auto *graphics_pipeline_library = find_pnext<VkGraphicsPipelineLibraryCreateInfoEXT>(
			VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_LIBRARY_CREATE_INFO_EXT,
			create_info.pNext);

	// If we're not creating a library, assume we're defining a complete pipeline.
	if ((create_info.flags & VK_PIPELINE_CREATE_LIBRARY_BIT_KHR) != 0 && graphics_pipeline_library)
		state_flags = graphics_pipeline_library->flags;

	return state_flags;
}